

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O2

void Abc_NtkFraigPartitionedTime(Abc_Ntk_t *pNtk,void *pParams)

{
  uint nCap;
  abctime aVar1;
  Vec_Ptr_t *p;
  Abc_Frame_t *pAVar2;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  Vec_Int_t *vOuts;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *Entry;
  abctime aVar4;
  uint uVar5;
  int i;
  int iVar6;
  uint i_00;
  
  aVar1 = Abc_Clock();
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    p = Abc_NtkPartitionSmart(pNtk,300,0);
    pAVar2 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar2,"unset progressbar");
    p_00 = Vec_PtrAlloc(1000);
    nCap = p->nSize;
    p_01 = Vec_PtrAlloc(nCap);
    uVar5 = 0;
    if (0 < (int)nCap) {
      uVar5 = nCap;
    }
    i_00 = 0;
    while (uVar5 != i_00) {
      vOuts = (Vec_Int_t *)Vec_PtrEntry(p,i_00);
      Abc_NtkConvertCos(pNtk,vOuts,p_00);
      pAVar3 = Abc_NtkCreateConeArray(pNtk,p_00,0);
      Entry = Abc_NtkFraig(pAVar3,pParams,0,0);
      Vec_PtrPush(p_01,Entry);
      Abc_NtkDelete(pAVar3);
      i_00 = i_00 + 1;
      printf("Finished part %5d (out of %5d)\r",(ulong)i_00,(ulong)nCap);
    }
    Vec_VecFree((Vec_Vec_t *)p);
    pAVar2 = Abc_FrameGetGlobalFrame();
    Cmd_CommandExecute(pAVar2,"set progressbar");
    iVar6 = p_01->nSize;
    for (i = 0; i < iVar6; i = i + 1) {
      pAVar3 = (Abc_Ntk_t *)Vec_PtrEntry(p_01,i);
      Abc_NtkDelete(pAVar3);
    }
    Vec_PtrFree(p_01);
    Vec_PtrFree(p_00);
    iVar6 = (int)p_00;
    Abc_Print(iVar6,"%s =","Partitioned fraiging time");
    aVar4 = Abc_Clock();
    Abc_Print(iVar6,"%9.2f sec\n",(double)(aVar4 - aVar1) / 1000000.0);
    return;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                ,0x491,"void Abc_NtkFraigPartitionedTime(Abc_Ntk_t *, void *)");
}

Assistant:

void Abc_NtkFraigPartitionedTime( Abc_Ntk_t * pNtk, void * pParams )
{
    Vec_Ptr_t * vParts, * vFraigs, * vOnePtr;
    Vec_Int_t * vOne;
    Abc_Ntk_t * pNtkAig, * pNtkFraig;
    int i;
    abctime clk = Abc_Clock();

    // perform partitioning
    assert( Abc_NtkIsStrash(pNtk) );
//    vParts = Abc_NtkPartitionNaive( pNtk, 20 );
    vParts = Abc_NtkPartitionSmart( pNtk, 300, 0 );

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "unset progressbar" );

    // fraig each partition
    vOnePtr = Vec_PtrAlloc( 1000 );
    vFraigs = Vec_PtrAlloc( Vec_PtrSize(vParts) );
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vOne, i )
    {
        Abc_NtkConvertCos( pNtk, vOne, vOnePtr );
        pNtkAig = Abc_NtkCreateConeArray( pNtk, vOnePtr, 0 );
        pNtkFraig = Abc_NtkFraig( pNtkAig, pParams, 0, 0 );
        Vec_PtrPush( vFraigs, pNtkFraig );
        Abc_NtkDelete( pNtkAig );

        printf( "Finished part %5d (out of %5d)\r", i+1, Vec_PtrSize(vParts) );
    }
    Vec_VecFree( (Vec_Vec_t *)vParts );

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "set progressbar" );

    // derive the final network
    Vec_PtrForEachEntry( Abc_Ntk_t *, vFraigs, pNtkAig, i )
        Abc_NtkDelete( pNtkAig );
    Vec_PtrFree( vFraigs );
    Vec_PtrFree( vOnePtr );
    ABC_PRT( "Partitioned fraiging time", Abc_Clock() - clk );
}